

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::ScaleParameter::ScaleParameter(ScaleParameter *this,ScaleParameter *from)

{
  void *pvVar1;
  undefined3 uVar2;
  int32 iVar3;
  uint uVar4;
  FillerParameter *pFVar5;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ScaleParameter_006fa920;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  uVar4 = (from->_has_bits_).has_bits_[0];
  if ((uVar4 & 1) == 0) {
    this->filler_ = (FillerParameter *)0x0;
  }
  else {
    pFVar5 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(pFVar5,from->filler_);
    this->filler_ = pFVar5;
    uVar4 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar4 & 2) == 0) {
    pFVar5 = (FillerParameter *)0x0;
  }
  else {
    pFVar5 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(pFVar5,from->bias_filler_);
  }
  this->bias_filler_ = pFVar5;
  uVar2 = *(undefined3 *)&from->field_0x29;
  iVar3 = from->axis_;
  this->bias_term_ = from->bias_term_;
  *(undefined3 *)&this->field_0x29 = uVar2;
  this->axis_ = iVar3;
  this->num_axes_ = from->num_axes_;
  return;
}

Assistant:

ScaleParameter::ScaleParameter(const ScaleParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_filler()) {
    filler_ = new ::caffe::FillerParameter(*from.filler_);
  } else {
    filler_ = NULL;
  }
  if (from.has_bias_filler()) {
    bias_filler_ = new ::caffe::FillerParameter(*from.bias_filler_);
  } else {
    bias_filler_ = NULL;
  }
  ::memcpy(&bias_term_, &from.bias_term_,
    reinterpret_cast<char*>(&num_axes_) -
    reinterpret_cast<char*>(&bias_term_) + sizeof(num_axes_));
  // @@protoc_insertion_point(copy_constructor:caffe.ScaleParameter)
}